

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O1

bool duckdb::ConvertFloatingToUhugeint<double>(double value,uhugeint_t *result)

{
  ulong uVar1;
  double dVar2;
  
  if ((((ulong)ABS(value) < 0x7ff0000000000000) && (0.0 <= value)) &&
     (value < 3.402823669209385e+38)) {
    dVar2 = fmod(value,1.8446744073709552e+19);
    result->lower = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
    uVar1 = (ulong)(value * 5.421010862427522e-20);
    result->upper =
         (long)uVar1 >> 0x3f & (long)(value * 5.421010862427522e-20 - 9.223372036854776e+18) | uVar1
    ;
    return true;
  }
  return false;
}

Assistant:

bool ConvertFloatingToUhugeint(REAL_T value, uhugeint_t &result) {
	if (!Value::IsFinite<REAL_T>(value)) {
		return false;
	}
	if (value < 0 || value >= 340282366920938463463374607431768211456.0) {
		return false;
	}
	result.lower = (uint64_t)fmod(value, REAL_T(NumericLimits<uint64_t>::Maximum()));
	result.upper = (uint64_t)(value / REAL_T(NumericLimits<uint64_t>::Maximum()));
	return true;
}